

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O2

Cut_Cut_t * Cut_NodeUnionCutsSeq(Cut_Man_t *p,Vec_Int_t *vNodes,int CutSetNum,int fFirst)

{
  uint uVar1;
  int Node;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Cut_Cut_t *pCVar5;
  Cut_Cut_t *pCVar6;
  abctime aVar7;
  Cut_Cut_t *pCVar8;
  int iVar9;
  Cut_Cut_t *local_130;
  Cut_List_t Super;
  
  uVar1 = p->pParams->nVarsMax;
  aVar4 = Abc_Clock();
  Cut_ListStart(&Super);
  pCVar6 = (Cut_Cut_t *)0x0;
  Node = Vec_IntEntry(vNodes,0);
  p->nNodeCuts = 1;
  pCVar5 = Cut_NodeReadCutsOld(p,Node);
  p->pCompareOld = pCVar5;
  if (-1 < CutSetNum) {
    pCVar6 = Cut_NodeReadCutsNew(p,Node);
  }
  p->pCompareNew = pCVar6;
  local_130 = Cut_NodeReadCutsOld(p,Node);
  if ((local_130 == (Cut_Cut_t *)0x0) &&
     (local_130 = Cut_NodeReadCutsNew(p,Node), local_130 == (Cut_Cut_t *)0x0)) {
    __assert_fail("pTop != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                  ,0x331,"Cut_Cut_t *Cut_NodeUnionCutsSeq(Cut_Man_t *, Vec_Int_t *, int, int)");
  }
  p->vTemp->nSize = 0;
  iVar9 = 1;
  for (iVar3 = 0; iVar3 < vNodes->nSize; iVar3 = iVar3 + 1) {
    iVar2 = Vec_IntEntry(vNodes,iVar3);
    if (iVar3 == 0 && -1 < CutSetNum) {
      pCVar5 = Cut_NodeReadCutsTemp(p,CutSetNum);
      Cut_NodeWriteCutsTemp(p,CutSetNum,(Cut_Cut_t *)0x0);
    }
    else {
      pCVar5 = Cut_NodeReadCutsNew(p,iVar2);
      Cut_NodeWriteCutsNew(p,iVar2,(Cut_Cut_t *)0x0);
    }
    if (pCVar5 != (Cut_Cut_t *)0x0) {
      if (fFirst == 0) goto LAB_003f0dfb;
      pCVar6 = pCVar5->pNext;
      pCVar5->pNext = (Cut_Cut_t *)0x0;
      if (iVar3 == 0) {
        Cut_ListAdd(&Super,pCVar5);
      }
      else {
        Cut_CutRecycle(p,pCVar5);
      }
      pCVar5 = pCVar6;
      if (pCVar6 != (Cut_Cut_t *)0x0) goto LAB_003f0dfb;
      pCVar6 = (Cut_Cut_t *)0x0;
      pCVar5 = (Cut_Cut_t *)0x0;
      while (pCVar8 = pCVar6, pCVar5 != (Cut_Cut_t *)0x0) {
        if (*(uint *)pCVar5 >> 0x1c == uVar1) {
          Vec_PtrPush(p->vTemp,pCVar5);
          break;
        }
        if ((p->pParams->fFilter == 0) ||
           ((iVar2 = Cut_CutFilterOne(p,&Super,pCVar5), iVar2 == 0 &&
            ((p->pParams->fSeq == 0 ||
             (((p->pCompareOld == (Cut_Cut_t *)0x0 ||
               (iVar2 = Cut_CutFilterOld(p,p->pCompareOld,pCVar5), iVar2 == 0)) &&
              ((p->pCompareNew == (Cut_Cut_t *)0x0 ||
               (iVar2 = Cut_CutFilterOld(p,p->pCompareNew,pCVar5), iVar2 == 0)))))))))) {
          *(uint *)pCVar5 =
               (*(uint *)pCVar5 & 0xff7fffff) +
               ((*(uint *)local_130 ^ *(uint *)pCVar5) & 0x400000) * 2;
          pCVar6 = pCVar5->pNext;
          pCVar5->pNext = (Cut_Cut_t *)0x0;
          Cut_ListAdd(&Super,pCVar5);
          iVar2 = p->nNodeCuts + 1;
          p->nNodeCuts = iVar2;
          if (iVar2 == p->pParams->nKeepMax) {
            if (pCVar6 == (Cut_Cut_t *)0x0) {
              pCVar5 = (Cut_Cut_t *)0x0;
              goto LAB_003f1057;
            }
            goto LAB_003f1050;
          }
        }
        pCVar6 = (Cut_Cut_t *)0x0;
        pCVar5 = pCVar8;
        if (pCVar8 != (Cut_Cut_t *)0x0) {
LAB_003f0dfb:
          pCVar6 = pCVar5->pNext;
        }
      }
    }
    iVar9 = iVar9 + 1;
  }
  for (iVar9 = 0; iVar9 < p->vTemp->nSize; iVar9 = iVar9 + 1) {
    pCVar5 = (Cut_Cut_t *)Vec_PtrEntry(p->vTemp,iVar9);
    if (pCVar5 != (Cut_Cut_t *)0x0) goto LAB_003f1000;
    pCVar6 = (Cut_Cut_t *)0x0;
    while (pCVar8 = pCVar6, pCVar5 != (Cut_Cut_t *)0x0) {
      if ((p->pParams->fFilter == 0) ||
         ((iVar3 = Cut_CutFilterOne(p,&Super,pCVar5), iVar3 == 0 &&
          ((p->pParams->fSeq == 0 ||
           (((p->pCompareOld == (Cut_Cut_t *)0x0 ||
             (iVar3 = Cut_CutFilterOld(p,p->pCompareOld,pCVar5), iVar3 == 0)) &&
            ((p->pCompareNew == (Cut_Cut_t *)0x0 ||
             (iVar3 = Cut_CutFilterOld(p,p->pCompareNew,pCVar5), iVar3 == 0)))))))))) {
        *(uint *)pCVar5 =
             (*(uint *)pCVar5 & 0xff7fffff) +
             ((*(uint *)local_130 ^ *(uint *)pCVar5) & 0x400000) * 2;
        pCVar6 = pCVar5->pNext;
        pCVar5->pNext = (Cut_Cut_t *)0x0;
        Cut_ListAdd(&Super,pCVar5);
        iVar3 = p->nNodeCuts + 1;
        p->nNodeCuts = iVar3;
        if (iVar3 == p->pParams->nKeepMax) {
          if (pCVar6 == (Cut_Cut_t *)0x0) {
            pCVar5 = (Cut_Cut_t *)0x0;
            pCVar8 = pCVar6;
            goto LAB_003f10e9;
          }
          goto LAB_003f10e2;
        }
      }
      pCVar6 = (Cut_Cut_t *)0x0;
      pCVar5 = pCVar8;
      if (pCVar8 != (Cut_Cut_t *)0x0) {
LAB_003f1000:
        pCVar6 = pCVar5->pNext;
      }
    }
  }
LAB_003f114d:
  pCVar5 = Cut_ListFinish(&Super);
  if (CutSetNum < 0) {
    pCVar6 = Cut_NodeReadCutsNew(p,Node);
    if (pCVar6 != (Cut_Cut_t *)0x0) {
      __assert_fail("Cut_NodeReadCutsNew(p, Root) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                    ,0x3b8,"Cut_Cut_t *Cut_NodeUnionCutsSeq(Cut_Man_t *, Vec_Int_t *, int, int)");
    }
    Cut_NodeWriteCutsNew(p,Node,pCVar5);
  }
  else {
    pCVar6 = Cut_NodeReadCutsTemp(p,CutSetNum);
    if (pCVar6 != (Cut_Cut_t *)0x0) {
      __assert_fail("Cut_NodeReadCutsTemp(p, CutSetNum) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                    ,0x3b3,"Cut_Cut_t *Cut_NodeUnionCutsSeq(Cut_Man_t *, Vec_Int_t *, int, int)");
    }
    Cut_NodeWriteCutsTemp(p,CutSetNum,pCVar5);
  }
  aVar7 = Abc_Clock();
  p->timeUnion = p->timeUnion + (aVar7 - aVar4);
  return pCVar5;
LAB_003f1050:
  pCVar5 = pCVar6->pNext;
LAB_003f1057:
  do {
    pCVar8 = pCVar5;
    if (pCVar6 == (Cut_Cut_t *)0x0) goto LAB_003f108e;
    Cut_CutRecycle(p,pCVar6);
    pCVar5 = (Cut_Cut_t *)0x0;
    pCVar6 = pCVar8;
  } while (pCVar8 == (Cut_Cut_t *)0x0);
  goto LAB_003f1050;
LAB_003f108e:
  for (; iVar9 < vNodes->nSize; iVar9 = iVar9 + 1) {
    iVar3 = Vec_IntEntry(vNodes,iVar9);
    Cut_NodeFreeCuts(p,iVar3);
  }
  for (iVar9 = 0; iVar9 < p->vTemp->nSize; iVar9 = iVar9 + 1) {
    pCVar5 = (Cut_Cut_t *)Vec_PtrEntry(p->vTemp,iVar9);
    if (pCVar5 != (Cut_Cut_t *)0x0) goto LAB_003f10d7;
    pCVar6 = (Cut_Cut_t *)0x0;
    while (pCVar8 = pCVar6, pCVar5 != (Cut_Cut_t *)0x0) {
      Cut_CutRecycle(p,pCVar5);
      pCVar6 = (Cut_Cut_t *)0x0;
      pCVar5 = pCVar8;
      if (pCVar8 != (Cut_Cut_t *)0x0) {
LAB_003f10d7:
        pCVar6 = pCVar5->pNext;
      }
    }
  }
  goto LAB_003f114d;
LAB_003f10e2:
  pCVar5 = pCVar6->pNext;
  pCVar8 = pCVar6;
LAB_003f10e9:
  do {
    pCVar6 = pCVar5;
    if (pCVar8 == (Cut_Cut_t *)0x0) goto LAB_003f1140;
    Cut_CutRecycle(p,pCVar8);
    pCVar5 = (Cut_Cut_t *)0x0;
    pCVar8 = pCVar6;
  } while (pCVar6 == (Cut_Cut_t *)0x0);
  goto LAB_003f10e2;
LAB_003f1140:
  while( true ) {
    iVar9 = iVar9 + 1;
    if (p->vTemp->nSize <= iVar9) break;
    pCVar5 = (Cut_Cut_t *)Vec_PtrEntry(p->vTemp,iVar9);
    if (pCVar5 != (Cut_Cut_t *)0x0) goto LAB_003f113a;
    pCVar6 = (Cut_Cut_t *)0x0;
    while (pCVar8 = pCVar6, pCVar5 != (Cut_Cut_t *)0x0) {
      Cut_CutRecycle(p,pCVar5);
      pCVar6 = (Cut_Cut_t *)0x0;
      pCVar5 = pCVar8;
      if (pCVar8 != (Cut_Cut_t *)0x0) {
LAB_003f113a:
        pCVar6 = pCVar5->pNext;
      }
    }
  }
  goto LAB_003f114d;
}

Assistant:

Cut_Cut_t * Cut_NodeUnionCutsSeq( Cut_Man_t * p, Vec_Int_t * vNodes, int CutSetNum, int fFirst )
{
    Cut_List_t Super, * pSuper = &Super;
    Cut_Cut_t * pList, * pListStart, * pCut, * pCut2, * pTop;
    int i, k, Node, Root, Limit = p->pParams->nVarsMax;
    abctime clk = Abc_Clock();

    // start the new list
    Cut_ListStart( pSuper );

    // remember the root node to save the resulting cuts
    Root = Vec_IntEntry( vNodes, 0 );
    p->nNodeCuts = 1;

    // store the original lists for comparison
    p->pCompareOld = Cut_NodeReadCutsOld( p, Root );
    p->pCompareNew = (CutSetNum >= 0)? Cut_NodeReadCutsNew( p, Root ) : NULL;

    // get the topmost cut
    pTop = NULL;
    if ( (pTop = Cut_NodeReadCutsOld( p, Root )) == NULL )
        pTop = Cut_NodeReadCutsNew( p, Root );
    assert( pTop != NULL );

    // collect small cuts first
    Vec_PtrClear( p->vTemp );
    Vec_IntForEachEntry( vNodes, Node, i )
    {
        // get the cuts of this node
        if ( i == 0 && CutSetNum >= 0 )
        {
            pList = Cut_NodeReadCutsTemp( p, CutSetNum );
            Cut_NodeWriteCutsTemp( p, CutSetNum, NULL );
        }
        else
        {
            pList = Cut_NodeReadCutsNew( p, Node );
            Cut_NodeWriteCutsNew( p, Node, NULL );
        }
        if ( pList == NULL )
            continue;

        // process the cuts
        if ( fFirst )
        {
            // remember the starting point
            pListStart = pList->pNext;
            pList->pNext = NULL;
            // save or recycle the elementary cut
            if ( i == 0 )
                Cut_ListAdd( pSuper, pList );
            else
                Cut_CutRecycle( p, pList );
        }
        else
            pListStart = pList;

        // save all the cuts that are smaller than the limit
        Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
        {
            if ( pCut->nLeaves == (unsigned)Limit )
            {
                Vec_PtrPush( p->vTemp, pCut );
                break;
            }
            // check containment
//            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
//                continue;
            if ( p->pParams->fFilter )
            {
                if ( Cut_CutFilterOne(p, pSuper, pCut) )
                    continue;
                if ( p->pParams->fSeq )
                {
                    if ( p->pCompareOld && Cut_CutFilterOld(p, p->pCompareOld, pCut) )
                        continue;
                    if ( p->pCompareNew && Cut_CutFilterOld(p, p->pCompareNew, pCut) )
                        continue;
                }
            }

            // set the complemented bit by comparing the first cut with the current cut
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart = pCut->pNext;
            pCut->pNext = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts of this node
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle all cuts of other nodes
                Vec_IntForEachEntryStart( vNodes, Node, k, i+1 )
                    Cut_NodeFreeCuts( p, Node );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, k )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    } 
    // collect larger cuts next
    Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, i )
    {
        Cut_ListForEachCutSafe( pList, pCut, pCut2 )
        {
            // check containment
//            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
//                continue;
            if ( p->pParams->fFilter )
            {
                if ( Cut_CutFilterOne(p, pSuper, pCut) )
                    continue;
                if ( p->pParams->fSeq )
                {
                    if ( p->pCompareOld && Cut_CutFilterOld(p, p->pCompareOld, pCut) )
                        continue;
                    if ( p->pCompareNew && Cut_CutFilterOld(p, p->pCompareNew, pCut) )
                        continue;
                }
            }

            // set the complemented bit
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart   = pCut->pNext;
            pCut->pNext  = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntryStart( Cut_Cut_t *, p->vTemp, pList, k, i+1 )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    }
finish :
    // set the cuts at the node
    pList = Cut_ListFinish( pSuper );

    // set the lists at the node
//    assert( Cut_NodeReadCutsNew(p, Root) == NULL );
//    Cut_NodeWriteCutsNew( p, Root, pList );
    if ( CutSetNum >= 0 )
    {
        assert( Cut_NodeReadCutsTemp(p, CutSetNum) == NULL );
        Cut_NodeWriteCutsTemp( p, CutSetNum, pList );
    }
    else
    {
        assert( Cut_NodeReadCutsNew(p, Root) == NULL );
        Cut_NodeWriteCutsNew( p, Root, pList );
    }

p->timeUnion += Abc_Clock() - clk;
    // filter the cuts
//clk = Abc_Clock();
//    if ( p->pParams->fFilter )
//        Cut_CutFilter( p, pList );
//p->timeFilter += Abc_Clock() - clk;
//    if ( fFirst )
//        p->nNodes -= vNodes->nSize - 1;
    return pList;
}